

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

void lua_pushcclosure(lua_State *L,lua_CFunction f,int n)

{
  uint64_t uVar1;
  GCfunc *pGVar2;
  ulong uVar3;
  GCRef *pGVar4;
  long lVar5;
  TValue *pTVar6;
  
  uVar1 = (L->glref).ptr64;
  if (*(ulong *)(uVar1 + 0x18) <= *(ulong *)(uVar1 + 0x10)) {
    lj_gc_step(L);
  }
  uVar3 = L->base[-2].u64 & 0x7fffffffffff;
  pGVar4 = &L->env;
  if (*(char *)(uVar3 + 9) == '\b') {
    pGVar4 = (GCRef *)(uVar3 + 0x10);
  }
  pGVar2 = lj_func_newC(L,n,(GCtab *)pGVar4->gcptr64);
  (pGVar2->c).f = f;
  lVar5 = (long)n;
  pTVar6 = L->top + -lVar5;
  L->top = pTVar6;
  if (n != 0) {
    do {
      *(TValue *)((long)pGVar2 + lVar5 * 8 + 0x28) = L->top[lVar5 + -1];
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    pTVar6 = L->top;
  }
  pTVar6->u64 = (ulong)pGVar2 | 0xfffb800000000000;
  pTVar6 = L->top;
  L->top = pTVar6 + 1;
  if ((TValue *)(L->maxstack).ptr64 <= pTVar6 + 1) {
    lj_state_growstack1(L);
    return;
  }
  return;
}

Assistant:

LUA_API void lua_pushcclosure(lua_State *L, lua_CFunction f, int n)
{
  GCfunc *fn;
  lj_gc_check(L);
  lj_checkapi_slot(n);
  fn = lj_func_newC(L, (MSize)n, getcurrenv(L));
  fn->c.f = f;
  L->top -= n;
  while (n--)
    copyTV(L, &fn->c.upvalue[n], L->top+n);
  setfuncV(L, L->top, fn);
  lj_assertL(iswhite(obj2gco(fn)), "new GC object is not white");
  incr_top(L);
}